

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactLinkerTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactLinkerTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  GeneratorExpressionContent *context_00;
  bool bVar1;
  ArtifactType artifact;
  allocator<char> local_69;
  string local_68;
  string local_48;
  cmGeneratorExpressionContext *local_28;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *target_local;
  
  local_28 = context;
  content_local = (GeneratorExpressionContent *)target;
  context_local = (cmGeneratorExpressionContext *)this;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar1 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)this);
  context_00 = content_local;
  if (bVar1) {
    bVar1 = cmGeneratorTarget::HasImportLibrary
                      ((cmGeneratorTarget *)context_local,
                       (string *)
                       &content_local[3].ParamChildren.
                        super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmGeneratorTarget::GetFullPath
              (__return_storage_ptr__,(cmGeneratorTarget *)context_local,
               (string *)
               &content_local[3].ParamChildren.
                super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint)bVar1,false);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_48,(GeneratorExpressionContent *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "TARGET_LINKER_FILE is allowed only for libraries and executables with ENABLE_EXPORTS."
               ,&local_69);
    reportError((cmGeneratorExpressionContext *)context_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The file used to link to the target (.so, .lib, .a).
    if (!target->IsLinkable()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_LINKER_FILE is allowed only for libraries and "
                    "executables with ENABLE_EXPORTS.");
      return std::string();
    }
    cmStateEnums::ArtifactType artifact =
      target->HasImportLibrary(context->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    return target->GetFullPath(context->Config, artifact);
  }